

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab.c
# Opt level: O3

void verify3(archive *a,archive_entry *ae)

{
  mode_t mVar1;
  la_int64_t lVar2;
  char *pcVar3;
  time_t v1;
  
  mVar1 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'á',(ulong)mVar1,"archive_entry_filetype(ae)",0x2000,"AE_IFCHR",(void *)0x0
                     );
  mVar1 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'â',(ulong)(mVar1 & 0x1ff),"archive_entry_mode(ae) & 0777",0x1a4,"0644",
                      (void *)0x0);
  lVar2 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ã',lVar2,"archive_entry_uid(ae)",0x3e9,"UID",(void *)0x0);
  lVar2 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ä',lVar2,"archive_entry_gid(ae)",0x3e9,"GID",(void *)0x0);
  pcVar3 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'å',pcVar3,"archive_entry_uname(ae)","cue","UNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'æ',pcVar3,"archive_entry_gname(ae)","cue","GNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'ç',pcVar3,"archive_entry_pathname(ae)","devchar","\"devchar\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_symlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'è',(uint)(pcVar3 == (char *)0x0),"archive_entry_symlink(ae) == NULL",
                   (void *)0x0);
  pcVar3 = archive_entry_hardlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'é',(uint)(pcVar3 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  v1 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ê',v1,"archive_entry_mtime(ae)",0x15181,"86401",(void *)0x0);
  return;
}

Assistant:

static void
verify3(const char *refname, enum comp_type comp)
{
	struct archive_entry *ae;
	struct archive *a;
	char zero[128];

	memset(zero, 0, sizeof(zero));
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular empty. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	if (comp != STORE) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	}
	/* Verify regular file1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file2. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	if (comp != STORE) {
		assertEqualInt(4, archive_file_count(a));
	} else {
		assertEqualInt(3, archive_file_count(a));
	}

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CAB, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}